

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>::dx
          (FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_> *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  value_type vVar5;
  value_type vVar6;
  
  vVar5 = FadFuncAtan<Fad<double>_>::dx(&this->left_->fadexpr_,i);
  pFVar3 = this->right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar4;
  dVar2 = pFVar3->val_;
  vVar6 = FadFuncAtan<Fad<double>_>::val(&this->left_->fadexpr_);
  return vVar6 * dVar1 + vVar5 * dVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}